

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O3

void __thiscall cm::String::String(String *this,string *s,Private param_2)

{
  pointer pcVar1;
  undefined1 local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string>
            (&local_18,&local_20,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_21,s);
  (this->string_).
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_20;
  (this->string_).
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_18._M_pi;
  pcVar1 = (local_20->_M_dataplus)._M_p;
  (this->view_)._M_len = local_20->_M_string_length;
  (this->view_)._M_str = pcVar1;
  return;
}

Assistant:

String::String(std::string&& s, Private)
  : string_(std::make_shared<std::string>(std::move(s)))
  , view_(this->string_->data(), this->string_->size())
{
}